

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  uint *puVar2;
  U32 *pUVar3;
  ZSTD_strategy ZVar4;
  BYTE *pBVar5;
  void *pvVar6;
  U32 *pUVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  U32 UVar13;
  uint uVar14;
  U32 reducerThreshold;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  pBVar5 = (ms->window).base;
  iVar15 = (int)pBVar5;
  if (0xe0000000 < (uint)((int)iend - iVar15)) {
    uVar14 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
    ZVar4 = (params->cParams).strategy;
    uVar10 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < ZVar4) & 0x1fU);
    uVar9 = (int)ip - iVar15;
    uVar12 = uVar10 - 1 & uVar9;
    uVar17 = 2;
    if (2 < uVar10) {
      uVar17 = uVar10;
    }
    iVar15 = 0;
    if (1 < uVar12) {
      uVar17 = 0;
    }
    if (uVar10 <= uVar14) {
      uVar10 = uVar14;
    }
    uVar9 = uVar9 - (uVar10 + uVar12 + uVar17);
    (ms->window).base = pBVar5 + uVar9;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar9;
    uVar17 = (ms->window).dictLimit;
    uVar10 = (ms->window).lowLimit;
    uVar12 = uVar9 + 2;
    UVar13 = uVar10 - uVar9;
    if (uVar10 < uVar12) {
      UVar13 = 2;
    }
    (ms->window).lowLimit = UVar13;
    UVar13 = uVar17 - uVar9;
    if (uVar17 < uVar12) {
      UVar13 = 2;
    }
    (ms->window).dictLimit = UVar13;
    pUVar7 = &(ms->window).nbOverflowCorrections;
    *pUVar7 = *pUVar7 + 1;
    pvVar6 = ws->objectEnd;
    ws->tableValidEnd = pvVar6;
    iVar11 = 1 << ((byte)(params->cParams).hashLog & 0x1f);
    iVar16 = iVar11 + 0xf;
    if (-1 < iVar11) {
      iVar16 = iVar11;
    }
    if (0xf < iVar11) {
      pUVar7 = ms->hashTable;
      iVar11 = 0;
      do {
        lVar18 = 0;
        do {
          puVar2 = pUVar7 + iVar15 + lVar18;
          uVar17 = puVar2[1];
          uVar10 = puVar2[2];
          uVar14 = puVar2[3];
          pUVar3 = pUVar7 + iVar15 + lVar18;
          *pUVar3 = ~-(uint)((int)(*puVar2 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                    *puVar2 - uVar9;
          pUVar3[1] = ~-(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      uVar17 - uVar9;
          pUVar3[2] = ~-(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      uVar10 - uVar9;
          pUVar3[3] = ~-(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      uVar14 - uVar9;
          lVar18 = lVar18 + 4;
        } while (lVar18 != 0x10);
        iVar15 = iVar15 + 0x10;
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar16 >> 4);
    }
    if ((ms->dedicatedDictSearch != 0) ||
       ((ZVar4 != ZSTD_fast &&
        ((2 < ZVar4 - ZSTD_greedy || (params->useRowMatchFinder != ZSTD_ps_enable)))))) {
      iVar16 = 1 << ((byte)(params->cParams).chainLog & 0x1f);
      iVar15 = iVar16 + 0xf;
      if (-1 < iVar16) {
        iVar15 = iVar16;
      }
      pUVar7 = ms->chainTable;
      if (ZVar4 == ZSTD_btlazy2) {
        if (0xf < iVar16) {
          iVar16 = 0;
          iVar11 = 0;
          do {
            lVar18 = 0;
            do {
              puVar2 = pUVar7 + iVar16 + lVar18;
              uVar17 = *puVar2;
              uVar10 = puVar2[1];
              uVar14 = puVar2[2];
              uVar8 = puVar2[3];
              pUVar3 = pUVar7 + iVar16 + lVar18;
              *pUVar3 = (~-(uint)(uVar17 == 1) &
                        ~-(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar17 - uVar9) + (uint)(uVar17 == 1);
              pUVar3[1] = (~-(uint)(uVar10 == 1) &
                          ~-(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                          uVar10 - uVar9) + (uint)(uVar10 == 1);
              pUVar3[2] = (~-(uint)(uVar14 == 1) &
                          ~-(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                          uVar14 - uVar9) + (uint)(uVar14 == 1);
              pUVar3[3] = (~-(uint)(uVar8 == 1) &
                          ~-(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                          uVar8 - uVar9) + (uint)(uVar8 == 1);
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            iVar16 = iVar16 + 0x10;
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar15 >> 4);
        }
      }
      else if (0xf < iVar16) {
        iVar16 = 0;
        iVar11 = 0;
        do {
          lVar18 = 0;
          do {
            puVar2 = pUVar7 + iVar16 + lVar18;
            uVar17 = puVar2[1];
            uVar10 = puVar2[2];
            uVar14 = puVar2[3];
            pUVar3 = pUVar7 + iVar16 + lVar18;
            *pUVar3 = ~-(uint)((int)(*puVar2 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      *puVar2 - uVar9;
            pUVar3[1] = ~-(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar17 - uVar9;
            pUVar3[2] = ~-(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar10 - uVar9;
            pUVar3[3] = ~-(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar14 - uVar9;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          iVar16 = iVar16 + 0x10;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar15 >> 4);
      }
    }
    if (ms->hashLog3 != 0) {
      iVar16 = 1 << ((byte)ms->hashLog3 & 0x1f);
      iVar15 = iVar16 + 0xf;
      if (-1 < iVar16) {
        iVar15 = iVar16;
      }
      if (0xf < iVar16) {
        pUVar7 = ms->hashTable3;
        iVar16 = 0;
        iVar11 = 0;
        do {
          lVar18 = 0;
          do {
            puVar2 = pUVar7 + iVar16 + lVar18;
            uVar17 = puVar2[1];
            uVar10 = puVar2[2];
            uVar14 = puVar2[3];
            pUVar3 = pUVar7 + iVar16 + lVar18;
            *pUVar3 = ~-(uint)((int)(*puVar2 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      *puVar2 - uVar9;
            pUVar3[1] = ~-(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar17 - uVar9;
            pUVar3[2] = ~-(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar10 - uVar9;
            pUVar3[3] = ~-(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar14 - uVar9;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          iVar16 = iVar16 + 0x10;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar15 >> 4);
      }
    }
    if (pvVar6 < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    UVar13 = ms->nextToUpdate - uVar9;
    if (ms->nextToUpdate < uVar9) {
      UVar13 = 0;
    }
    ms->nextToUpdate = UVar13;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}